

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch.cc
# Opt level: O3

Point __thiscall
Patch::new_position_for_new_offset
          (Patch *this,uint32_t target_offset,
          function<unsigned_int_(Point)> *old_offset_for_old_position,
          function<Point_(unsigned_int)> *old_position_for_old_offset)

{
  int iVar1;
  uint uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  Point PVar5;
  Point start;
  uint uVar6;
  int iVar7;
  undefined4 in_register_00000034;
  Patch *this_00;
  Point this_01;
  Point *this_02;
  int iVar8;
  uint uVar9;
  Point node_old_start;
  Point preceding_old_position;
  PositionStackEntry left_ancestor_info;
  Point node_new_start;
  Point preceding_new_position;
  uint local_90;
  int local_8c;
  Point local_88;
  uint32_t local_7c;
  _Any_data *local_78;
  Point local_70;
  Point local_68;
  Point local_60;
  Point local_58;
  undefined8 local_50;
  Point local_48;
  Point local_40;
  Point local_38;
  
  this_00 = (Patch *)CONCAT44(in_register_00000034,target_offset);
  PVar5 = (Point)this->root;
  local_7c = target_offset;
  local_38 = (Point)old_position_for_old_offset;
  Point::Point(&local_60);
  Point::Point(&local_58);
  local_50 = 0;
  Point::Point(&local_40);
  Point::Point(&local_68);
  if (PVar5 == (Point)0x0) {
    local_8c = 0;
    local_90 = 0;
  }
  else {
    local_8c = 0;
    local_90 = 0;
    local_78 = (_Any_data *)old_offset_for_old_position;
    do {
      local_70 = Point::traverse(&local_60,(Point *)((long)PVar5 + 0x20));
      this_00 = (Patch *)((long)PVar5 + 0x28);
      this_01 = (Point)&local_58;
      local_48 = Point::traverse((Point *)this_01,(Point *)this_00);
      local_88 = local_70;
      if (*(long *)((long)old_offset_for_old_position + 0x10) == 0) goto LAB_00168dca;
      uVar2 = (**(code **)((long)old_offset_for_old_position + 0x18))
                        ((_Any_data *)old_offset_for_old_position,&local_88);
      old_position_for_old_offset = *(function<Point_(unsigned_int)> **)PVar5;
      iVar7 = local_50._4_4_ + uVar2;
      if ((Point)old_position_for_old_offset == (Point)0x0) {
        iVar8 = 0;
        iVar1 = (int)local_50;
      }
      else {
        iVar8 = *(int *)((long)old_position_for_old_offset + 0x48);
        iVar1 = (int)local_50 + *(int *)((long)old_position_for_old_offset + 0x44);
      }
      if (*(Point *)((long)PVar5 + 0x38) == (Point)0x0) {
        uVar3 = 0;
      }
      else {
        uVar3 = Text::size((Text *)*(Point *)((long)PVar5 + 0x38));
      }
      if (*(Point *)((long)PVar5 + 0x30) == (Point)0x0) {
        uVar4 = ((Point *)((long)PVar5 + 0x40))->row;
      }
      else {
        uVar4 = Text::size((Text *)*(Point *)((long)PVar5 + 0x30));
      }
      uVar9 = iVar8 + (iVar7 - iVar1);
      uVar6 = uVar3 + uVar9;
      if (local_7c < uVar6) {
        this_00 = (Patch *)(ulong)(local_7c - uVar9);
        if (uVar9 <= local_7c) {
          local_88 = Text::position_for_offset
                               (*(Text **)((long)PVar5 + 0x38),local_7c - uVar9,0,true);
          this_02 = &local_48;
          goto LAB_00168d97;
        }
        PVar5 = *(Point *)PVar5;
        old_offset_for_old_position = (function<unsigned_int_(Point)> *)local_78;
        if (PVar5 == (Point)0x0) break;
      }
      else {
        local_8c = uVar4 + uVar2;
        local_68 = Point::traverse(&local_70,(Point *)((long)PVar5 + 0x10));
        this_00 = (Patch *)((long)PVar5 + 0x18);
        local_40 = Point::traverse(&local_48,(Point *)this_00);
        old_offset_for_old_position = (function<unsigned_int_(Point)> *)local_78;
        local_90 = uVar6;
        if (*(Point *)((long)PVar5 + 8) == (Point)0x0) break;
        local_60 = local_68;
        old_position_for_old_offset = *(function<Point_(unsigned_int)> **)PVar5;
        if ((Point)old_position_for_old_offset == (Point)0x0) {
          iVar7 = 0;
        }
        else {
          iVar7 = *(int *)((long)old_position_for_old_offset + 0x44);
        }
        local_58 = local_40;
        if (*(Point *)((long)PVar5 + 0x30) == (Point)0x0) {
          uVar3 = ((Point *)((long)PVar5 + 0x40))->row;
        }
        else {
          uVar3 = Text::size((Text *)*(Point *)((long)PVar5 + 0x30));
          old_position_for_old_offset = *(function<Point_(unsigned_int)> **)PVar5;
        }
        iVar7 = (int)local_50 + uVar3 + iVar7;
        uVar3 = 0;
        iVar8 = 0;
        if ((Point)old_position_for_old_offset != (Point)0x0) {
          iVar8 = *(int *)((long)old_position_for_old_offset + 0x48);
        }
        local_50._0_4_ = iVar7;
        if (*(Point *)((long)PVar5 + 0x38) != (Point)0x0) {
          uVar3 = Text::size((Text *)*(Point *)((long)PVar5 + 0x38));
        }
        local_50 = CONCAT44(local_50._4_4_ + uVar3 + iVar8,(int)local_50);
        PVar5 = *(Point *)((long)PVar5 + 8);
      }
    } while (PVar5 != (Point)0x0);
  }
  local_88.row = (local_7c - local_90) + local_8c;
  this_01 = local_38;
  if (*(Point *)((long)local_38 + 0x10) != (Point)0x0) {
    local_70 = (Point)(*(code *)*(Point *)((long)local_38 + 0x18))(local_38,&local_88);
    local_88 = Point::traversal(&local_70,&local_68);
    this_02 = &local_40;
LAB_00168d97:
    PVar5 = Point::traverse(this_02,&local_88);
    return PVar5;
  }
LAB_00168dca:
  std::__throw_bad_function_call();
  grab_changes_in_range<Patch::OldCoordinates>
            ((vector<Patch::Change,_std::allocator<Patch::Change>_> *)this_01,this_00,start,
             (Point)old_position_for_old_offset,false);
  return this_01;
}

Assistant:

Point Patch::new_position_for_new_offset(uint32_t target_offset,
                                         function<uint32_t(Point)> old_offset_for_old_position,
                                         function<Point(uint32_t)> old_position_for_old_offset) const {
  const Node *node = root;
  Patch::PositionStackEntry left_ancestor_info;
  Point preceding_new_position, preceding_old_position;
  uint32_t preceding_old_offset = 0, preceding_new_offset = 0;

  while (node) {
    Point node_old_start = left_ancestor_info.old_end.traverse(node->old_distance_from_left_ancestor);
    Point node_new_start = left_ancestor_info.new_end.traverse(node->new_distance_from_left_ancestor);
    uint32_t node_old_start_offset = old_offset_for_old_position(node_old_start);
    uint32_t node_new_start_offset = node_old_start_offset -
      left_ancestor_info.total_old_text_size +
      left_ancestor_info.total_new_text_size -
      node->left_subtree_old_text_size() +
      node->left_subtree_new_text_size();
    uint32_t node_new_end_offset = node_new_start_offset + node->new_text_size();
    uint32_t node_old_end_offset = node_old_start_offset + node->old_text_size();

    if (node_new_end_offset <= target_offset) {
      preceding_old_position = node_old_start.traverse(node->old_extent);
      preceding_new_position = node_new_start.traverse(node->new_extent);
      preceding_old_offset = node_old_end_offset;
      preceding_new_offset = node_new_end_offset;
      if (node->right) {
        left_ancestor_info.old_end = preceding_old_position;
        left_ancestor_info.new_end = preceding_new_position;
        left_ancestor_info.total_old_text_size += node->left_subtree_old_text_size() + node->old_text_size();
        left_ancestor_info.total_new_text_size += node->left_subtree_new_text_size() + node->new_text_size();
        node = node->right;
      } else {
        break;
      }
    } else if (node_new_start_offset <= target_offset) {
      return node_new_start
        .traverse(node->new_text->position_for_offset(target_offset - node_new_start_offset));
    } else {
      if (node->left) {
        node = node->left;
      } else {
        break;
      }
    }
  }

  return preceding_new_position.traverse(
    old_position_for_old_offset(
      preceding_old_offset + (target_offset - preceding_new_offset)
    ).traversal(preceding_old_position)
  );
}